

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int attlist2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 0x21;
  if (tok != 0xf) {
    if (tok == 0x17) {
      state->handler = attlist3;
    }
    else {
      if (tok == 0x12) {
        iVar2 = 0x17;
        lVar3 = 0;
        do {
          iVar1 = (*enc->nameMatchesAscii)
                            (enc,ptr,end,
                             (char *)((long)&attlist2_types_rel +
                                     (long)*(int *)((long)&attlist2_types_rel + lVar3)));
          if (iVar1 != 0) {
            state->handler = attlist8;
            return iVar2;
          }
          lVar3 = lVar3 + 4;
          iVar2 = iVar2 + 1;
        } while (lVar3 != 0x20);
        iVar2 = (*enc->nameMatchesAscii)(enc,ptr,end,"NOTATION");
        if (iVar2 != 0) {
          state->handler = attlist5;
          return 0x21;
        }
      }
      state->handler = error;
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

static int PTRCALL
attlist2(PROLOG_STATE *state,
         int tok,
         const char *ptr,
         const char *end,
         const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_NAME:
    {
      static const char * const types[] = {
        KW_CDATA,
        KW_ID,
        KW_IDREF,
        KW_IDREFS,
        KW_ENTITY,
        KW_ENTITIES,
        KW_NMTOKEN,
        KW_NMTOKENS,
      };
      int i;
      for (i = 0; i < (int)(sizeof(types)/sizeof(types[0])); i++)
        if (XmlNameMatchesAscii(enc, ptr, end, types[i])) {
          state->handler = attlist8;
          return XML_ROLE_ATTRIBUTE_TYPE_CDATA + i;
        }
    }
    if (XmlNameMatchesAscii(enc, ptr, end, KW_NOTATION)) {
      state->handler = attlist5;
      return XML_ROLE_ATTLIST_NONE;
    }
    break;
  case XML_TOK_OPEN_PAREN:
    state->handler = attlist3;
    return XML_ROLE_ATTLIST_NONE;
  }
  return common(state, tok);
}